

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare_statement.cpp
# Opt level: O2

void __thiscall
duckdb::PrepareStatement::PrepareStatement(PrepareStatement *this,PrepareStatement *other)

{
  pointer pSVar1;
  
  SQLStatement::SQLStatement(&this->super_SQLStatement,&other->super_SQLStatement);
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__PrepareStatement_0178fa68;
  pSVar1 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->(&other->statement);
  (*pSVar1->_vptr_SQLStatement[3])(&this->statement,pSVar1);
  ::std::__cxx11::string::string((string *)&this->name,(string *)&other->name);
  return;
}

Assistant:

PrepareStatement::PrepareStatement(const PrepareStatement &other)
    : SQLStatement(other), statement(other.statement->Copy()), name(other.name) {
}